

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloter_interface.h
# Opt level: O0

epoll_event * __thiscall cppnet::AlloterWrap::PoolNew<epoll_event>(AlloterWrap *this)

{
  int iVar1;
  element_type *peVar2;
  undefined4 extraout_var;
  epoll_event *res;
  void *data;
  uint32_t sz;
  AlloterWrap *this_local;
  
  peVar2 = std::__shared_ptr_access<cppnet::Alloter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<cppnet::Alloter,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  iVar1 = (*peVar2->_vptr_Alloter[3])();
  this_local = (AlloterWrap *)CONCAT44(extraout_var,iVar1);
  if (this_local == (AlloterWrap *)0x0) {
    this_local = (AlloterWrap *)0x0;
  }
  else {
    memset(this_local,0,0xc);
  }
  return (epoll_event *)this_local;
}

Assistant:

T* AlloterWrap::PoolNew(Args&&... args) {
    uint32_t sz = sizeof(T);
    
    void* data = _alloter->MallocAlign(sz);
    if (!data) {
        return nullptr;
    }

    T* res = new(data) T(std::forward<Args>(args)...);
    return res;
}